

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall
leveldb::DBImpl::GetApproximateSizes(DBImpl *this,Range *range,int n,uint64_t *sizes)

{
  long lVar1;
  Version *pVVar2;
  long in_RCX;
  int in_EDX;
  InternalKey *in_RSI;
  Version *in_RDI;
  long in_FS_OFFSET;
  uint64_t limit;
  uint64_t start;
  int i;
  Version *v;
  MutexLock l;
  InternalKey k2;
  InternalKey k1;
  VersionSet *in_stack_ffffffffffffff38;
  undefined8 local_c0;
  Slice *in_stack_ffffffffffffff68;
  Slice *in_stack_ffffffffffffff70;
  int iVar3;
  undefined4 in_stack_ffffffffffffff7c;
  VersionSet *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MutexLock::MutexLock((MutexLock *)in_stack_ffffffffffffff38,(Mutex *)0xd15b9a);
  pVVar2 = VersionSet::current(in_stack_ffffffffffffff38);
  Version::Ref((Version *)in_stack_ffffffffffffff38);
  for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
    InternalKey::InternalKey
              ((InternalKey *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               CONCAT44(in_stack_ffffffffffffff7c,iVar3),(ValueType)((ulong)pVVar2 >> 0x20));
    InternalKey::InternalKey
              ((InternalKey *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               CONCAT44(in_stack_ffffffffffffff7c,iVar3),(ValueType)((ulong)pVVar2 >> 0x20));
    in_stack_ffffffffffffff70 =
         (Slice *)VersionSet::ApproximateOffsetOf(in_stack_ffffffffffffffb0,in_RDI,in_RSI);
    in_stack_ffffffffffffff68 =
         (Slice *)VersionSet::ApproximateOffsetOf(in_stack_ffffffffffffffb0,in_RDI,in_RSI);
    if (in_stack_ffffffffffffff68 < in_stack_ffffffffffffff70) {
      local_c0 = 0;
    }
    else {
      local_c0 = (long)in_stack_ffffffffffffff68 - (long)in_stack_ffffffffffffff70;
    }
    *(long *)(in_RCX + (long)iVar3 * 8) = local_c0;
    InternalKey::~InternalKey((InternalKey *)in_stack_ffffffffffffff38);
    InternalKey::~InternalKey((InternalKey *)in_stack_ffffffffffffff38);
  }
  Version::Unref((Version *)in_stack_ffffffffffffff38);
  MutexLock::~MutexLock((MutexLock *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::GetApproximateSizes(const Range* range, int n, uint64_t* sizes) {
  // TODO(opt): better implementation
  MutexLock l(&mutex_);
  Version* v = versions_->current();
  v->Ref();

  for (int i = 0; i < n; i++) {
    // Convert user_key into a corresponding internal key.
    InternalKey k1(range[i].start, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey k2(range[i].limit, kMaxSequenceNumber, kValueTypeForSeek);
    uint64_t start = versions_->ApproximateOffsetOf(v, k1);
    uint64_t limit = versions_->ApproximateOffsetOf(v, k2);
    sizes[i] = (limit >= start ? limit - start : 0);
  }

  v->Unref();
}